

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O0

int lws_urldecode_s_destroy(lws_spa *spa,lws_urldecode_stateful *s)

{
  int iVar1;
  int local_24;
  int ret;
  lws_urldecode_stateful *s_local;
  lws_spa *spa_local;
  
  local_24 = 0;
  if (s->state != US_IDLE) {
    local_24 = -1;
  }
  if ((local_24 == 0) && (iVar1 = (*s->output)(s->data,s->name,&s->out,s->pos,1), iVar1 != 0)) {
    local_24 = -1;
  }
  iVar1 = (*s->output)(s->data,s->name,(char **)0x0,0,3);
  if (iVar1 == 0) {
    if ((spa->i).ac == (lwsac **)0x0) {
      lws_realloc(s,0,"lws_free");
    }
    spa_local._4_4_ = local_24;
  }
  else {
    spa_local._4_4_ = -1;
  }
  return spa_local._4_4_;
}

Assistant:

static int
lws_urldecode_s_destroy(struct lws_spa *spa, struct lws_urldecode_stateful *s)
{
	int ret = 0;

	if (s->state != US_IDLE)
		ret = -1;

	if (!ret)
		if (s->output(s->data, s->name, &s->out, s->pos,
			      LWS_UFS_FINAL_CONTENT))
			ret = -1;

	if (s->output(s->data, s->name, NULL, 0, LWS_UFS_CLOSE))
		return -1;

	if (!spa->i.ac)
		lws_free(s);

	return ret;
}